

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

Option * __thiscall
CLI::App::add_option(App *this,string *name,callback_t *callback,string *description,bool defaulted)

{
  bool bVar1;
  reference this_00;
  Option *this_01;
  pointer pOVar2;
  OptionAlreadyAdded *this_02;
  string local_328;
  undefined1 local_301;
  function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
  local_300;
  string local_2e0;
  string local_2c0;
  reference local_2a0;
  Option_p *option;
  Option *local_290;
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *local_288;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  local_280;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  local_278;
  function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
  local_270;
  string local_240;
  string local_220;
  undefined1 local_200 [8];
  Option myopt;
  bool defaulted_local;
  string *description_local;
  callback_t *callback_local;
  string *name_local;
  App *this_local;
  
  myopt._463_1_ = defaulted;
  ::std::__cxx11::string::string((string *)&local_220,(string *)name);
  ::std::__cxx11::string::string((string *)&local_240,(string *)description);
  std::
  function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
  ::function(&local_270,callback);
  Option::Option((Option *)local_200,&local_220,&local_240,&local_270,(bool)(myopt._463_1_ & 1),this
                );
  std::
  function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
  ::~function(&local_270);
  ::std::__cxx11::string::~string((string *)&local_240);
  ::std::__cxx11::string::~string((string *)&local_220);
  local_280._M_current =
       (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
       ::std::
       begin<std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>
                 (&this->options_);
  local_288 = (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
              ::std::
              end<std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>
                        (&this->options_);
  local_290 = (Option *)local_200;
  local_278 = ::std::
              find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>*,std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>,CLI::App::add_option(std::__cxx11::string,std::function<bool(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)>,std::__cxx11::string,bool)::_lambda(std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const&)_1_>
                        (local_280,
                         (__normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                          )local_288,(anon_class_8_1_a852a0a7_for__M_pred)local_290);
  option = (Option_p *)
           ::std::
           end<std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>
                     (&this->options_);
  bVar1 = __gnu_cxx::operator==
                    (&local_278,
                     (__normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                      *)&option);
  if (!bVar1) {
    this_02 = (OptionAlreadyAdded *)__cxa_allocate_exception(0x38);
    Option::get_name_abi_cxx11_(&local_328,(Option *)local_200,false,false);
    OptionAlreadyAdded::OptionAlreadyAdded(this_02,&local_328);
    __cxa_throw(this_02,&OptionAlreadyAdded::typeinfo,OptionAlreadyAdded::~OptionAlreadyAdded);
  }
  std::
  vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
  ::emplace_back<>(&this->options_);
  this_00 = std::
            vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
            ::back(&this->options_);
  local_2a0 = this_00;
  this_01 = (Option *)operator_new(0x1d0);
  local_301 = 1;
  ::std::__cxx11::string::string((string *)&local_2c0,(string *)name);
  ::std::__cxx11::string::string((string *)&local_2e0,(string *)description);
  std::
  function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
  ::function(&local_300,callback);
  Option::Option(this_01,&local_2c0,&local_2e0,&local_300,(bool)(myopt._463_1_ & 1),this);
  local_301 = 0;
  std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::reset(this_00,this_01);
  std::
  function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
  ::~function(&local_300);
  ::std::__cxx11::string::~string((string *)&local_2e0);
  ::std::__cxx11::string::~string((string *)&local_2c0);
  pOVar2 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::get(local_2a0);
  OptionBase<CLI::OptionDefaults>::copy_to<CLI::Option>
            (&(this->option_defaults_).super_OptionBase<CLI::OptionDefaults>,pOVar2);
  pOVar2 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::get(local_2a0);
  Option::~Option((Option *)local_200);
  return pOVar2;
}

Assistant:

Option *add_option(std::string name, callback_t callback, std::string description = "", bool defaulted = false) {
        Option myopt{name, description, callback, defaulted, this};

        if(std::find_if(std::begin(options_), std::end(options_), [&myopt](const Option_p &v) {
               return *v == myopt;
           }) == std::end(options_)) {
            options_.emplace_back();
            Option_p &option = options_.back();
            option.reset(new Option(name, description, callback, defaulted, this));
            option_defaults_.copy_to(option.get());
            return option.get();
        } else
            throw OptionAlreadyAdded(myopt.get_name());
    }